

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::RewindLoopFixedGroupLastIterationCont::Exec
          (RewindLoopFixedGroupLastIterationCont *this,Matcher *matcher,Char *input,
          CharCount *inputOffset,uint8 **instPointer,ContStack *contStack,
          AssertionStack *assertionStack,uint *qcTicks)

{
  int iVar1;
  uint uVar2;
  Program *pPVar3;
  long lVar4;
  GroupInfo *pGVar5;
  code *pcVar6;
  bool bVar7;
  undefined4 *puVar8;
  CharCount CVar9;
  Type TVar10;
  long lVar11;
  LoopInfo *pLVar12;
  ulong uVar13;
  
  Matcher::QueryContinue(matcher,qcTicks);
  uVar13 = (ulong)*(uint *)&(this->super_Cont).field_0xc;
  if ((ulong)(((matcher->program).ptr)->rep).insts.instsLen < uVar13 + 0x1c) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x774,"(label + sizeof(T) <= program->rep.insts.instsLen)",
                       "label + sizeof(T) <= program->rep.insts.instsLen");
    if (!bVar7) goto LAB_00f05f70;
    *puVar8 = 0;
  }
  if ((((matcher->program).ptr)->rep).insts.insts.ptr[uVar13] != 'N') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x775,"(((Inst*)(program->rep.insts.insts + label))->tag == tag)",
                       "((Inst*)(program->rep.insts.insts + label))->tag == tag");
    if (!bVar7) goto LAB_00f05f70;
    *puVar8 = 0;
  }
  pPVar3 = (matcher->program).ptr;
  lVar4 = *(long *)&pPVar3->rep;
  iVar1 = *(int *)(lVar4 + 1 + uVar13);
  if (((long)iVar1 < 0) || (pPVar3->numLoops <= iVar1)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x77b,"(loopId >= 0 && loopId < program->numLoops)",
                       "loopId >= 0 && loopId < program->numLoops");
    if (!bVar7) goto LAB_00f05f70;
    *puVar8 = 0;
  }
  pLVar12 = (matcher->loopInfos).ptr + iVar1;
  iVar1 = *(int *)(lVar4 + 0x17 + uVar13);
  lVar11 = (long)iVar1;
  if ((lVar11 < 0) || ((int)(uint)((matcher->program).ptr)->numGroups <= iVar1)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x782,"(groupId >= 0 && groupId < program->numGroups)",
                       "groupId >= 0 && groupId < program->numGroups");
    if (!bVar7) goto LAB_00f05f70;
    *puVar8 = 0;
  }
  pGVar5 = (matcher->groupInfos).ptr;
  if (this->tryingBody == true) {
    this->tryingBody = false;
    if (pLVar12->number < *(uint *)(lVar4 + 5 + uVar13)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                         ,0x12ee,"(loopInfo->number >= begin->repeats.lower)",
                         "loopInfo->number >= begin->repeats.lower");
      if (!bVar7) goto LAB_00f05f70;
      *puVar8 = 0;
    }
  }
  else {
    if (pLVar12->number <= *(uint *)(lVar4 + 5 + uVar13)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                         ,0x12f3,"(loopInfo->number > begin->repeats.lower)",
                         "loopInfo->number > begin->repeats.lower");
      if (!bVar7) goto LAB_00f05f70;
      *puVar8 = 0;
    }
    pLVar12->number = pLVar12->number - 1;
  }
  CVar9 = *(int *)(lVar4 + 0x13 + uVar13) * pLVar12->number + pLVar12->startInputOffset;
  *inputOffset = CVar9;
  uVar2 = pLVar12->number;
  if (uVar2 == 0) {
    TVar10 = 0xffffffff;
  }
  else {
    TVar10 = *(Type *)(lVar4 + 0x13 + uVar13);
    pGVar5[lVar11].offset = CVar9 - TVar10;
  }
  pGVar5[lVar11].length = TVar10;
  if (*(uint *)(lVar4 + 5 + uVar13) < uVar2) {
    ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::
    UnPop<UnifiedRegex::RewindLoopFixedGroupLastIterationCont>
              (&contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
    Matcher::UnPopStats(matcher,contStack,input);
  }
  uVar2 = *(uint *)(lVar4 + 0xf + uVar13);
  if ((((matcher->program).ptr)->rep).insts.instsLen <= uVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x76d,"(label < program->rep.insts.instsLen)",
                       "label < program->rep.insts.instsLen");
    if (!bVar7) {
LAB_00f05f70:
      pcVar6 = (code *)invalidInstructionException();
      (*pcVar6)();
    }
    *puVar8 = 0;
  }
  *instPointer = (((matcher->program).ptr)->rep).insts.insts.ptr + uVar2;
  return true;
}

Assistant:

inline bool RewindLoopFixedGroupLastIterationCont::Exec(REGEX_CONT_EXEC_PARAMETERS)
    {
        matcher.QueryContinue(qcTicks);

        BeginLoopFixedGroupLastIterationInst* begin = matcher.L2I(BeginLoopFixedGroupLastIteration, beginLabel);
        LoopInfo* loopInfo = matcher.LoopIdToLoopInfo(begin->loopId);
        GroupInfo* groupInfo = matcher.GroupIdToGroupInfo(begin->groupId);

        if (tryingBody)
        {
            tryingBody = false;
            // loopInfo->number is the number of iterations completed before current attempt of body
            Assert(loopInfo->number >= begin->repeats.lower);
        }
        else
        {
            // loopInfo->number is the number of iterations completed before trying follow
            Assert(loopInfo->number > begin->repeats.lower);
            // Try follow with one fewer iteration
            loopInfo->number--;
        }

        // Rewind input
        inputOffset = loopInfo->startInputOffset + loopInfo->number * begin->length;

        if (loopInfo->number > 0)
        {
            // Bind previous iteration's body
            groupInfo->offset = inputOffset - begin->length;
            groupInfo->length = begin->length;
        }
        else
        {
            groupInfo->Reset();
        }

        if (loopInfo->number > begin->repeats.lower)
        {
            // Un-pop the continuation ready for next time
            contStack.UnPop<RewindLoopFixedGroupLastIterationCont>();
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.UnPopStats(contStack, input);
#endif
        }
        // else: Can't try any fewer iterations if follow fails, so leave continuation as popped and let failure propagate

        instPointer = matcher.LabelToInstPointer(begin->exitLabel);
        return true; // STOP BACKTRACKING
    }